

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O2

ParameterDeclarationSyntax * __thiscall
psy::C::
List<psy::C::ParameterDeclarationSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ParameterDeclarationSyntax_*>_>
::lastValue(List<psy::C::ParameterDeclarationSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ParameterDeclarationSyntax_*>_>
            *this)

{
  ParameterDeclarationSyntax *pPVar1;
  ParameterDeclarationSyntax *v;
  
  v = (ParameterDeclarationSyntax *)0x0;
  while ((SyntaxNodeSeparatedList<psy::C::ParameterDeclarationSyntax_*> *)this !=
         (SyntaxNodeSeparatedList<psy::C::ParameterDeclarationSyntax_*> *)0x0) {
    pPVar1 = *(ParameterDeclarationSyntax **)
              ((long)&((SyntaxNodeSeparatedList<psy::C::ParameterDeclarationSyntax_*> *)this)->
                      super_CoreSyntaxNodeList<psy::C::ParameterDeclarationSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ParameterDeclarationSyntax_*>_>
              + 8);
    this = *(List<psy::C::ParameterDeclarationSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ParameterDeclarationSyntax_*>_>
             **)((long)&((SyntaxNodeSeparatedList<psy::C::ParameterDeclarationSyntax_*> *)this)->
                        super_CoreSyntaxNodeList<psy::C::ParameterDeclarationSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ParameterDeclarationSyntax_*>_>
                + 0x10);
    if (pPVar1 != (ParameterDeclarationSyntax *)0x0) {
      v = pPVar1;
    }
  }
  return v;
}

Assistant:

ValueT lastValue() const
    {
        ValueT v = nullptr;
        for (auto it = const_cast<DerivedListT*>(static_cast<const DerivedListT*>(this));
                it;
                it = it->next) {
            if (it->value)
                v = it->value;
        }
        return v;
    }